

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

int av1_search_intra_uv_modes_in_interframe
              (IntraModeSearchState *intra_search_state,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize
              ,RD_STATS *rd_stats,RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,int64_t best_rd)

{
  BLOCK_SIZE BVar1;
  uint8_t uVar2;
  byte bVar3;
  MB_MODE_INFO *pMVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  UV_PREDICTION_MODE UVar10;
  int iVar11;
  long lVar12;
  byte bVar13;
  byte max_tx_size;
  
  pMVar4 = *(x->e_mbd).mi;
  if ((cpi->oxcf).tool_cfg.enable_palette == true) {
    BVar1 = pMVar4->bsize;
    bVar13 = (BLOCK_8X4 < BVar1 && (BVar1 & ~BLOCK_8X4) != BLOCK_64X128) &
             (BVar1 & ~BLOCK_4X8) != BLOCK_128X64 &
             (cpi->common).features.allow_screen_content_tools;
  }
  else {
    bVar13 = 0;
  }
  if (intra_search_state->rate_uv_intra != 0x7fffffff) {
    iVar11 = intra_search_state->rate_uv_tokenonly;
    lVar12 = intra_search_state->dist_uvs;
    UVar10 = intra_search_state->mode_uv;
    goto LAB_00247d1a;
  }
  if ((x->e_mbd).lossless[*(ushort *)&pMVar4->field_0xa7 & 7] == 0) {
    bVar3 = ""[av1_ss_size_lookup[pMVar4->bsize][(x->e_mbd).plane[1].subsampling_x]
               [(x->e_mbd).plane[1].subsampling_y]];
    if (bVar3 < 0x11) {
      max_tx_size = 3;
      if ((1 < bVar3 - 0xb) && (max_tx_size = 3, bVar3 != 4)) {
LAB_00247df4:
        max_tx_size = bVar3;
      }
    }
    else if (bVar3 == 0x11) {
      max_tx_size = 9;
    }
    else {
      if (bVar3 != 0x12) goto LAB_00247df4;
      max_tx_size = 10;
    }
  }
  else {
    max_tx_size = 0;
  }
  av1_rd_pick_intra_sbuv_mode
            (cpi,x,&intra_search_state->rate_uv_intra,&intra_search_state->rate_uv_tokenonly,
             &intra_search_state->dist_uvs,&intra_search_state->skip_uvs,bsize,max_tx_size);
  UVar10 = pMVar4->uv_mode;
  intra_search_state->mode_uv = UVar10;
  if (bVar13 != 0) {
    *(undefined2 *)(intra_search_state->pmi_uv).palette_size =
         *(undefined2 *)(pMVar4->palette_mode_info).palette_size;
    uVar5 = *(undefined8 *)(pMVar4->palette_mode_info).palette_colors;
    uVar6 = *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 4);
    uVar7 = *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 8);
    uVar8 = *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0xc);
    uVar9 = *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0x14);
    *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x10) =
         *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0x10);
    *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x14) = uVar9;
    *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 8) = uVar7;
    *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0xc) = uVar8;
    *(undefined8 *)(intra_search_state->pmi_uv).palette_colors = uVar5;
    *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 4) = uVar6;
  }
  intra_search_state->uv_angle_delta = pMVar4->angle_delta[1];
  iVar11 = intra_search_state->rate_uv_tokenonly;
  lVar12 = intra_search_state->dist_uvs;
  if (best_rd < lVar12 * 0x80 + ((long)x->rdmult * (long)iVar11 + 0x100 >> 9)) {
    intra_search_state->skip_intra_modes = 1;
    return 0;
  }
LAB_00247d1a:
  rd_stats_uv->rate = iVar11;
  rd_stats_uv->dist = lVar12;
  uVar2 = intra_search_state->skip_uvs;
  rd_stats_uv->skip_txfm = uVar2;
  rd_stats->skip_txfm = uVar2 != '\0' && rd_stats_y->skip_txfm != '\0';
  pMVar4->uv_mode = UVar10;
  if (bVar13 != 0) {
    (pMVar4->palette_mode_info).palette_size[1] = (intra_search_state->pmi_uv).palette_size[1];
    uVar5 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0xc);
    uVar6 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x10);
    uVar7 = *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 0x14);
    *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 8) =
         *(undefined8 *)((intra_search_state->pmi_uv).palette_colors + 8);
    *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0xc) = uVar5;
    *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0x10) = uVar6;
    *(undefined8 *)((pMVar4->palette_mode_info).palette_colors + 0x14) = uVar7;
  }
  pMVar4->angle_delta[1] = intra_search_state->uv_angle_delta;
  return 1;
}

Assistant:

int av1_search_intra_uv_modes_in_interframe(
    IntraModeSearchState *intra_search_state, const AV1_COMP *cpi,
    MACROBLOCK *x, BLOCK_SIZE bsize, RD_STATS *rd_stats,
    const RD_STATS *rd_stats_y, RD_STATS *rd_stats_uv, int64_t best_rd) {
  const AV1_COMMON *cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->ref_frame[0] == INTRA_FRAME);

  // TODO(chiyotsai@google.com): Consolidate the chroma search code here with
  // the one in av1_search_palette_mode.
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int try_palette =
      cpi->oxcf.tool_cfg.enable_palette &&
      av1_allow_palette(cm->features.allow_screen_content_tools, mbmi->bsize);

  assert(intra_search_state->rate_uv_intra == INT_MAX);
  if (intra_search_state->rate_uv_intra == INT_MAX) {
    // If no good uv-predictor had been found, search for it.
    const TX_SIZE uv_tx = av1_get_tx_size(AOM_PLANE_U, xd);
    av1_rd_pick_intra_sbuv_mode(cpi, x, &intra_search_state->rate_uv_intra,
                                &intra_search_state->rate_uv_tokenonly,
                                &intra_search_state->dist_uvs,
                                &intra_search_state->skip_uvs, bsize, uv_tx);
    intra_search_state->mode_uv = mbmi->uv_mode;
    if (try_palette) intra_search_state->pmi_uv = *pmi;
    intra_search_state->uv_angle_delta = mbmi->angle_delta[PLANE_TYPE_UV];

    const int uv_rate = intra_search_state->rate_uv_tokenonly;
    const int64_t uv_dist = intra_search_state->dist_uvs;
    const int64_t uv_rd = RDCOST(x->rdmult, uv_rate, uv_dist);
    if (uv_rd > best_rd) {
      // If there is no good intra uv-mode available, we can skip all intra
      // modes.
      intra_search_state->skip_intra_modes = 1;
      return 0;
    }
  }

  // If we are here, then the encoder has found at least one good intra uv
  // predictor, so we can directly copy its statistics over.
  // TODO(any): the stats here is not right if the best uv mode is CFL but the
  // best y mode is palette.
  rd_stats_uv->rate = intra_search_state->rate_uv_tokenonly;
  rd_stats_uv->dist = intra_search_state->dist_uvs;
  rd_stats_uv->skip_txfm = intra_search_state->skip_uvs;
  rd_stats->skip_txfm = rd_stats_y->skip_txfm && rd_stats_uv->skip_txfm;
  mbmi->uv_mode = intra_search_state->mode_uv;
  if (try_palette) {
    pmi->palette_size[1] = intra_search_state->pmi_uv.palette_size[1];
    memcpy(pmi->palette_colors + PALETTE_MAX_SIZE,
           intra_search_state->pmi_uv.palette_colors + PALETTE_MAX_SIZE,
           2 * PALETTE_MAX_SIZE * sizeof(pmi->palette_colors[0]));
  }
  mbmi->angle_delta[PLANE_TYPE_UV] = intra_search_state->uv_angle_delta;

  return 1;
}